

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  handle value;
  handle value_00;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  PyObject *pPVar6;
  char *pcVar7;
  PyObject **ppPVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  PyTypeObject *pPVar9;
  handle *in_RDI;
  PyTypeObject *type;
  PyHeapTypeObject *heap_type;
  PyTypeObject *metaclass;
  PyObject *base;
  tuple bases;
  internals *internals;
  size_t size;
  char *tp_doc;
  char *full_name;
  object module_;
  object qualname;
  object name;
  PyTypeObject *in_stack_fffffffffffffc48;
  handle in_stack_fffffffffffffc50;
  PyHeapTypeObject *pPVar10;
  handle in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  object_api<pybind11::handle> *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  handle in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  PyTypeObject *local_348;
  PyObject *local_330;
  handle local_2c8;
  handle local_2c0;
  PyObject *local_2b8;
  handle local_208;
  PyHeapTypeObject *local_200;
  handle local_1f8 [10];
  PyHeapTypeObject *local_1a8;
  PyTypeObject *local_1a0;
  byte local_191;
  PyObject *local_170;
  internals *local_160;
  size_t local_158;
  char *local_150;
  byte local_145;
  allocator<char> local_144;
  byte local_143;
  byte local_142;
  byte local_141;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  char *local_d8;
  PyObject *local_a8;
  PyObject *local_78;
  handle local_70 [5];
  handle local_48 [2];
  PyObject *local_38;
  handle local_18;
  handle local_10;
  handle *local_8;
  
  local_8 = in_RDI;
  pPVar6 = (PyObject *)PyUnicode_FromString(in_RDI[1].m_ptr);
  pybind11::handle::handle(&local_18,pPVar6);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffc58);
  object::object((object *)in_stack_fffffffffffffc50.m_ptr,(object *)in_stack_fffffffffffffc48);
  bVar1 = pybind11::handle::operator_cast_to_bool(local_8);
  if (bVar1) {
    pybind11::handle::ptr(local_8);
    iVar3 = _PyObject_TypeCheck(in_stack_fffffffffffffc50.m_ptr,in_stack_fffffffffffffc48);
    if (iVar3 == 0) {
      local_38 = local_8->m_ptr;
      bVar1 = hasattr(in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
      if (bVar1) {
        object_api<pybind11::handle>::attr
                  (in_stack_fffffffffffffc68,
                   (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
        pPVar6 = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x164a2a);
        ppPVar8 = pybind11::handle::ptr(&local_10);
        pPVar6 = (PyObject *)PyUnicode_FromFormat("%U.%U",pPVar6,*ppPVar8);
        pybind11::handle::handle(local_48,pPVar6);
        reinterpret_steal<pybind11::object>(in_stack_fffffffffffffc58);
        object::operator=((object *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          (object *)in_stack_fffffffffffffc58.m_ptr);
        object::~object((object *)0x164ab4);
        accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x164ac1);
      }
    }
  }
  object::object((object *)0x164b28);
  bVar1 = pybind11::handle::operator_cast_to_bool(local_8);
  if (bVar1) {
    local_78 = local_8->m_ptr;
    bVar1 = hasattr(in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
    if (bVar1) {
      object_api<pybind11::handle>::attr
                (in_stack_fffffffffffffc68,
                 (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      accessor::operator_cast_to_object
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                 in_stack_fffffffffffffc58.m_ptr);
      object::operator=((object *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                        (object *)in_stack_fffffffffffffc58.m_ptr);
      object::~object((object *)0x164bd5);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x164be2);
    }
    else {
      local_a8 = local_8->m_ptr;
      bVar1 = hasattr(in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
      if (bVar1) {
        object_api<pybind11::handle>::attr
                  (in_stack_fffffffffffffc68,
                   (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
        accessor::operator_cast_to_object
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                   in_stack_fffffffffffffc58.m_ptr);
        object::operator=((object *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          (object *)in_stack_fffffffffffffc58.m_ptr);
        object::~object((object *)0x164cbd);
        accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x164cca);
      }
    }
  }
  bVar1 = pybind11::handle::operator_cast_to_bool(local_70);
  local_141 = 0;
  local_142 = 0;
  local_143 = 0;
  local_145 = 0;
  if (bVar1) {
    str::str((str *)in_stack_fffffffffffffc90,
             (object *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_141 = 1;
    object::cast<std::__cxx11::string>((object *)in_stack_fffffffffffffc48);
    local_142 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc58.m_ptr,(char *)in_stack_fffffffffffffc50.m_ptr);
    local_143 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc58.m_ptr,(char *)in_stack_fffffffffffffc50.m_ptr);
  }
  else {
    std::allocator<char>::allocator();
    local_145 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,
               (char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
               (allocator<char> *)in_stack_fffffffffffffc80.m_ptr);
  }
  pcVar7 = c_str<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffc50.m_ptr);
  std::__cxx11::string::~string(local_f8);
  if ((local_145 & 1) != 0) {
    std::allocator<char>::~allocator(&local_144);
  }
  if ((local_143 & 1) != 0) {
    std::__cxx11::string::~string(local_118);
  }
  if ((local_142 & 1) != 0) {
    std::__cxx11::string::~string(local_138);
  }
  if ((local_141 & 1) != 0) {
    str::~str((str *)0x164e8f);
  }
  local_150 = (char *)0x0;
  local_d8 = pcVar7;
  if ((local_8[10].m_ptr != (PyObject *)0x0) &&
     (bVar1 = options::show_user_defined_docstrings(), bVar1)) {
    local_158 = strlen((char *)local_8[10].m_ptr);
    local_158 = local_158 + 1;
    local_150 = (char *)PyObject_Malloc(local_158);
    memcpy(local_150,local_8[10].m_ptr,local_158);
  }
  local_160 = get_internals();
  tuple::tuple((tuple *)in_stack_fffffffffffffc90,
               (object *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  local_191 = 0;
  bVar1 = tuple::empty((tuple *)0x165072);
  if (bVar1) {
    local_330 = local_160->instance_base;
  }
  else {
    tuple::operator[]((tuple *)in_stack_fffffffffffffc58.m_ptr,
                      (size_t)in_stack_fffffffffffffc50.m_ptr);
    local_191 = 1;
    local_330 = accessor<pybind11::detail::accessor_policies::tuple_item>::ptr
                          ((accessor<pybind11::detail::accessor_policies::tuple_item> *)0x1650d1);
  }
  if ((local_191 & 1) != 0) {
    accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
              ((accessor<pybind11::detail::accessor_policies::tuple_item> *)0x165113);
  }
  local_170 = local_330;
  pPVar6 = pybind11::handle::ptr(local_8 + 0xb);
  if (pPVar6 == (PyObject *)0x0) {
    local_348 = local_160->default_metaclass;
  }
  else {
    local_348 = (PyTypeObject *)pybind11::handle::ptr(local_8 + 0xb);
  }
  local_1a0 = local_348;
  local_1a8 = (PyHeapTypeObject *)(*local_348->tp_alloc)(local_348,0);
  if (local_1a8 != (PyHeapTypeObject *)0x0) {
    local_1f8[0] = object::release((object *)in_stack_fffffffffffffc48);
    ppPVar8 = pybind11::handle::ptr(local_1f8);
    local_1a8->ht_name = *ppPVar8;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           pybind11::handle::inc_ref((handle *)in_stack_fffffffffffffc50.m_ptr);
    pPVar6 = pybind11::handle::ptr((handle *)this);
    local_1a8->ht_qualname = pPVar6;
    local_200 = local_1a8;
    (local_1a8->ht_type).tp_name = local_d8;
    (local_1a8->ht_type).tp_doc = local_150;
    pPVar9 = type_incref((PyTypeObject *)0x165380);
    (local_200->ht_type).tp_base = pPVar9;
    (local_200->ht_type).tp_basicsize = 0x38;
    uVar2 = tuple::empty((tuple *)0x1653af);
    if (!(bool)uVar2) {
      in_stack_fffffffffffffc80 = object::release((object *)in_stack_fffffffffffffc48);
      local_208 = in_stack_fffffffffffffc80;
      ppPVar8 = pybind11::handle::ptr(&local_208);
      (local_200->ht_type).tp_bases = *ppPVar8;
    }
    (local_200->ht_type).tp_init = pybind11_object_init;
    (local_200->ht_type).tp_as_number = &local_1a8->as_number;
    (local_200->ht_type).tp_as_sequence = &local_1a8->as_sequence;
    (local_200->ht_type).tp_as_mapping = &local_1a8->as_mapping;
    (local_200->ht_type).tp_as_async = &local_1a8->as_async;
    (local_200->ht_type).tp_flags = (local_200->ht_type).tp_flags | 0x200;
    if ((*(byte *)&local_8[0xc].m_ptr >> 5 & 1) == 0) {
      (local_200->ht_type).tp_flags = (local_200->ht_type).tp_flags | 0x400;
    }
    if ((*(byte *)&local_8[0xc].m_ptr >> 1 & 1) != 0) {
      enable_dynamic_attributes(local_1a8);
    }
    if ((*(byte *)&local_8[0xc].m_ptr >> 2 & 1) != 0) {
      enable_buffer_protocol(local_1a8);
    }
    iVar3 = PyType_Ready(local_200);
    if (-1 < iVar3) {
      if ((*(byte *)&local_8[0xc].m_ptr >> 1 & 1) == 0) {
        iVar5 = PyType_HasFeature(&local_200->ht_type,0x4000);
        uVar4 = (uint)((iVar5 != 0 ^ 0xffU) & 1);
      }
      else {
        uVar4 = PyType_HasFeature(&local_200->ht_type,0x4000);
      }
      if (uVar4 == 0) {
        __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/detail/class.h"
                      ,0x2b3,"PyObject *pybind11::detail::make_new_python_type(const type_record &)"
                     );
      }
      bVar1 = pybind11::handle::operator_cast_to_bool(local_8);
      if (bVar1) {
        local_2b8 = local_8->m_ptr;
        pybind11::handle::handle(&local_2c0,(PyObject *)local_200);
        value.m_ptr._4_4_ = iVar3;
        value.m_ptr._0_4_ = in_stack_fffffffffffffc78;
        setattr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc70,value);
      }
      else {
        _Py_INCREF((PyObject *)local_200);
      }
      bVar1 = pybind11::handle::operator_cast_to_bool(local_70);
      if (bVar1) {
        pybind11::handle::handle(&local_2c8,(PyObject *)local_200);
        value_00.m_ptr._4_4_ = iVar3;
        value_00.m_ptr._0_4_ = in_stack_fffffffffffffc78;
        setattr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc70,value_00);
      }
      pPVar10 = local_200;
      tuple::~tuple((tuple *)0x16582d);
      object::~object((object *)0x16583a);
      object::~object((object *)0x165847);
      object::~object((object *)0x165854);
      return (PyObject *)pPVar10;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(uVar2,in_stack_fffffffffffffc88),
               (allocator<char> *)in_stack_fffffffffffffc80.m_ptr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc58.m_ptr,(char *)in_stack_fffffffffffffc50.m_ptr);
    error_string_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffc88),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc80.m_ptr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc58.m_ptr,(char *)in_stack_fffffffffffffc50.m_ptr);
    pybind11_fail((string *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
             (allocator<char> *)in_stack_fffffffffffffc80.m_ptr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc58.m_ptr,(char *)in_stack_fffffffffffffc50.m_ptr);
  pybind11_fail((string *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
#if PY_MAJOR_VERSION >= 3
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
#else
        qualname = str(rec.scope.attr("__qualname__").cast<std::string>() + "." + rec.name);
#endif
    }

    object module_;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module_ = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module_ = rec.scope.attr("__name__");
    }

    auto full_name = c_str(
#if !defined(PYPY_VERSION)
        module_ ? str(module_).cast<std::string>() + "." + rec.name :
#endif
        rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.empty()) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *)base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (!bases.empty())
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
#if PY_VERSION_HEX >= 0x03050000
    type->tp_as_async = &heap_type->as_async;
#endif

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif
    if (!rec.is_final)
        type->tp_flags |= Py_TPFLAGS_BASETYPE;

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);
    else
        Py_INCREF(type); // Keep it alive forever (reference leak)

    if (module_) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module_);

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}